

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O3

void unlink_release(ll_head *q_head,ll_elem *n,int inslock)

{
  long *plVar1;
  atomic_size_t *paVar2;
  long lVar3;
  atomic_size_t aVar4;
  ulong uVar5;
  ll_elem *old;
  ulong uVar6;
  elem_ptr_t *peVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  if ((ll_head *)((ulong)q_head & 0xfffffffffffffffc) != q_head) {
    __assert_fail("n == ptr_clear(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x2f4,
                  "void unlink_release(struct ll_head *, struct ll_elem *, int)");
  }
  uVar8 = (q_head->q).refcnt;
  while (1 < uVar8) {
    uVar8 = (q_head->q).refcnt;
  }
  uVar8 = (q_head->q).pred;
  uVar9 = (q_head->q).succ & 0xfffffffffffffffc;
  if (uVar9 == 0) {
    __assert_fail("s != NULL && p != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x2fe,
                  "void unlink_release(struct ll_head *, struct ll_elem *, int)");
  }
  uVar6 = uVar9;
  if ((int)n != 0) {
    LOCK();
    uVar6 = (q_head->q).succ;
    (q_head->q).succ = (q_head->q).succ | 2;
    UNLOCK();
    if ((uVar6 >> 1 & 1) != 0) {
      __assert_fail("!(ns & FLAGGED)",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x30d,"void unlink_release(struct ll_head *, struct ll_elem *, int)");
    }
    uVar6 = uVar9 | 2;
  }
  while( true ) {
    LOCK();
    uVar5 = (q_head->q).succ;
    bVar10 = uVar6 == uVar5;
    if (bVar10) {
      (q_head->q).succ = (ulong)((uint)uVar6 & 2) + 1;
      uVar5 = uVar6;
    }
    UNLOCK();
    if (bVar10) break;
    if ((uVar5 & 0xfffffffffffffffe) != uVar6) {
      __assert_fail("s_cas",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x311,"void unlink_release(struct ll_head *, struct ll_elem *, int)");
    }
  }
  LOCK();
  uVar6 = (q_head->q).succ;
  (q_head->q).succ = (q_head->q).succ & 0xfffffffffffffffe;
  UNLOCK();
  if ((uVar6 & 1) != 0) {
    LOCK();
    plVar1 = (long *)(uVar9 + 0x10);
    lVar3 = *plVar1;
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (lVar3 != 0) {
      peVar7 = &(q_head->q).pred;
      uVar8 = uVar8 & 0xfffffffffffffffc;
      uVar9 = uVar8 + 2;
      while( true ) {
        LOCK();
        uVar6 = *peVar7;
        bVar10 = uVar9 == uVar6;
        if (bVar10) {
          *peVar7 = 3;
          uVar6 = uVar9;
        }
        UNLOCK();
        if (bVar10) break;
        if ((uVar6 & 0xfffffffffffffffe) != uVar9) {
          __assert_fail("p_cas",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x316,"void unlink_release(struct ll_head *, struct ll_elem *, int)");
        }
      }
      LOCK();
      *peVar7 = *peVar7 & 0xfffffffffffffffd;
      UNLOCK();
      LOCK();
      uVar9 = *peVar7;
      *peVar7 = *peVar7 & 0xfffffffffffffffe;
      UNLOCK();
      if ((uVar9 & 1) == 0) goto LAB_00101914;
      LOCK();
      plVar1 = (long *)(uVar8 + 0x10);
      lVar3 = *plVar1;
      *plVar1 = *plVar1 + -1;
      UNLOCK();
      if (lVar3 != 0) {
        if ((int)n == 0) {
          LOCK();
          paVar2 = &(((ll_head *)((ulong)q_head & 0xfffffffffffffffc))->q).refcnt;
          aVar4 = *paVar2;
          *paVar2 = *paVar2 - 1;
          UNLOCK();
          if (aVar4 == 0) goto LAB_001018f5;
        }
        return;
      }
    }
LAB_001018f5:
    __assert_fail("old >= count",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x9a,
                  "void deref_release(struct ll_head *, struct ll_elem *, size_t)");
  }
LAB_00101914:
  __assert_fail("p & DEREF",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xf5,
                "void ptr_clear_deref(elem_ptr_t *)");
}

Assistant:

static void
unlink_release(struct ll_head *q_head, struct ll_elem *n, int inslock)
{
	struct ll_elem	*p, *s;
	int		 p_cas, s_cas;

	assert(n == ptr_clear(n));

	/* Wait until the last reference to n, not held by us, goes away. */
	while (atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 1)
		SPINWAIT();

	s = ptr_clear((struct ll_elem*)atomic_load_explicit(&n->succ,
	    memory_order_acquire));
	p = flag_combine((struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_acquire), (struct ll_elem*)FLAGGED);
	assert(s != NULL && p != NULL);

	/*
	 * Clear out the pred and succ pointers.
	 * Set succ to 0 before setting pred to 0, since the former is used to
	 * detect if the element is on the queue.
	 *
	 * Since ptr_cas maintains the FLAGGED bit, clear it manually
	 * afterwards.
	 */
	if (inslock) {
		uintptr_t ns;

		ns = atomic_fetch_or_explicit(&n->succ, FLAGGED,
		    memory_order_acq_rel);
		assert(!(ns & FLAGGED));
		s = flag_combine(s, (struct ll_elem*)FLAGGED);
	}
	s_cas = ptr_cas(&n->succ, &s, NULL);
	assert(s_cas);
	ptr_clear_deref(&n->succ);
	deref_release(q_head, s, 1);

	p_cas = ptr_cas(&n->pred, &p, NULL);
	assert(p_cas);
	atomic_fetch_and_explicit(&n->pred, ~FLAGGED, memory_order_release);
	ptr_clear_deref(&n->pred);
	deref_release(q_head, p, 1);

	/* Release our reference. */
	if (!inslock)
		deref_release(q_head, n, 1);
}